

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O3

ReadStatus __thiscall
PartiallyDownloadedBlock::FillBlock
          (PartiallyDownloadedBlock *this,CBlock *block,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx_missing)

{
  CBlockHeader *this_00;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_01;
  long lVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer psVar3;
  base_blob<256U> *pbVar4;
  bool bVar5;
  pointer psVar6;
  undefined8 *puVar7;
  CChainParams *pCVar8;
  Logger *pLVar9;
  undefined8 uVar10;
  CTransaction *__tmp;
  long lVar11;
  ulong uVar12;
  ReadStatus RVar13;
  CBlockHeader *pCVar14;
  BlockValidationState *pBVar15;
  ulong uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  byte bVar18;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  CheckBlockFn check_block;
  string local_108;
  string local_e8;
  BlockValidationState state;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_78;
  undefined2 local_60;
  bool local_5e;
  uint256 hash;
  
  bVar18 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->header).nBits == 0) {
LAB_0044c56e:
    RVar13 = READ_STATUS_INVALID;
  }
  else {
    this_00 = &this->header;
    CBlockHeader::GetHash(&hash,this_00);
    local_5e = false;
    local_60 = 0;
    pCVar14 = this_00;
    pBVar15 = &state;
    for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
      uVar10._0_4_ = pCVar14->nVersion;
      uVar10._4_1_ = (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0];
      uVar10._5_1_ = (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1];
      uVar10._6_1_ = (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2];
      uVar10._7_1_ = (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3];
      (pBVar15->super_ValidationState<BlockValidationResult>).m_mode = (undefined4)uVar10;
      (pBVar15->super_ValidationState<BlockValidationResult>).m_result =
           (int)((ulong)uVar10 >> 0x20);
      pCVar14 = (CBlockHeader *)((long)pCVar14 + (ulong)bVar18 * -0x10 + 8);
      pBVar15 = (BlockValidationState *)((long)pBVar15 + (ulong)bVar18 * -0x10 + 8);
    }
    memmove(block,this_00,0x50);
    this_01 = &block->vtx;
    check_block.super__Function_base._M_manager =
         (_Manager_type)
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    check_block.super__Function_base._M_functor._M_unused._M_object =
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    check_block.super__Function_base._M_functor._8_8_ =
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (block->vtx).
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (block->vtx).
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar16 = 0;
    (block->vtx).
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&check_block);
    block->m_checked_merkle_root = local_5e;
    block->fChecked = (bool)(undefined1)local_60;
    block->m_checked_witness_commitment = (bool)local_60._1_1_;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_78);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::resize(this_01,(long)(this->txn_available).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->txn_available).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
    psVar6 = (this->txn_available).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->txn_available).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar6) {
      lVar11 = 8;
      uVar12 = 0;
      uVar17 = 0;
      do {
        lVar2 = *(long *)((long)psVar6 + lVar11 + -8);
        if (lVar2 == 0) {
          psVar6 = (vtx_missing->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(vtx_missing->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4) <=
              uVar17) goto LAB_0044c56e;
          uVar16 = uVar17 + 1;
          psVar3 = (this_01->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          psVar6 = psVar6 + uVar17;
          *(element_type **)((long)psVar3 + lVar11 + -8) =
               (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(psVar3->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar11),
                     &(psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
        }
        else {
          puVar7 = (undefined8 *)
                   ((long)&(psVar6->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar11);
          psVar6 = (this_01->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = *puVar7;
          puVar7[-1] = 0;
          *puVar7 = 0;
          *(long *)((long)psVar6 + lVar11 + -8) = lVar2;
          this_02 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(psVar6->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar11);
          *(undefined8 *)
           ((long)&(psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr + lVar11) = uVar10;
          uVar16 = uVar17;
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
        }
        uVar12 = uVar12 + 1;
        psVar6 = (this->txn_available).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x10;
        uVar17 = uVar16;
      } while (uVar12 < (ulong)((long)(this->txn_available).
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4
                               ));
    }
    *(undefined8 *)((this->header).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
    (this->header).nBits = 0;
    (this->header).nNonce = 0;
    pbVar4 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    pbVar4 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    *(undefined8 *)((this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
    pbVar4 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[4] = '\0';
    (pbVar4->m_data)._M_elems[5] = '\0';
    (pbVar4->m_data)._M_elems[6] = '\0';
    (pbVar4->m_data)._M_elems[7] = '\0';
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    pbVar4 = &(this->header).hashPrevBlock.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    pbVar4 = &(this->header).hashPrevBlock.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    this_00->nVersion = 0;
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = '\0';
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = '\0';
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = '\0';
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = '\0';
    pbVar4 = &(this->header).hashPrevBlock.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[4] = '\0';
    (pbVar4->m_data)._M_elems[5] = '\0';
    (pbVar4->m_data)._M_elems[6] = '\0';
    (pbVar4->m_data)._M_elems[7] = '\0';
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::clear(&this->txn_available);
    RVar13 = READ_STATUS_INVALID;
    if ((long)(vtx_missing->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(vtx_missing->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 4 == uVar16) {
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
      state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
      state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
           '\0';
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
           '\0';
      if ((this->m_check_block_mock).super__Function_base._M_manager == (_Manager_type)0x0) {
        check_block.super__Function_base._M_functor._8_8_ = 0;
        check_block.super__Function_base._M_functor._M_unused._M_object = CheckBlock;
        check_block._M_invoker =
             std::
             _Function_handler<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool),_bool_(*)(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
             ::_M_invoke;
        check_block.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool),_bool_(*)(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
             ::_M_manager;
      }
      else {
        std::
        function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
        ::function(&check_block,&this->m_check_block_mock);
      }
      pCVar8 = Params();
      local_e8._M_dataplus._M_p._0_1_ = 1;
      local_108._M_dataplus._M_p._0_1_ = 1;
      if (check_block.super__Function_base._M_manager == (_Manager_type)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          uVar10 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
              &local_e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_
                                    ),local_e8.field_2._M_allocated_capacity + 1);
          }
          if (check_block.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*check_block.super__Function_base._M_manager)
                      ((_Any_data *)&check_block,(_Any_data *)&check_block,__destroy_functor);
          }
          ValidationState<BlockValidationResult>::~ValidationState
                    (&state.super_ValidationState<BlockValidationResult>);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            _Unwind_Resume(uVar10);
          }
        }
        goto LAB_0044c911;
      }
      bVar5 = (*check_block._M_invoker)
                        ((_Any_data *)&check_block,block,&state,&pCVar8->consensus,(bool *)&local_e8
                         ,(bool *)&local_108);
      if (bVar5) {
        pLVar9 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,CMPCTBLOCK,Debug);
        if (bVar5) {
          base_blob<256u>::ToString_abi_cxx11_(&local_e8,&hash);
          local_108._M_dataplus._M_p =
               (pointer)((long)(vtx_missing->
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(vtx_missing->
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4);
          logging_function._M_str = "FillBlock";
          logging_function._M_len = 9;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
          ;
          source_file._M_len = 0x62;
          LogPrintFormatInternal<std::__cxx11::string,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (logging_function,source_file,0xdc,CMPCTBLOCK,Debug,
                     (ConstevalFormatString<5U>)0x815a70,&local_e8,&this->prefilled_count,
                     &this->mempool_count,&this->extra_count,(unsigned_long *)&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
              &local_e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_
                                    ),local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        psVar6 = (vtx_missing->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar3 = (vtx_missing->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        RVar13 = READ_STATUS_OK;
        if ((ulong)((long)psVar3 - (long)psVar6) < 0x41 && psVar3 != psVar6) {
          do {
            pLVar9 = LogInstance();
            bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar9,CMPCTBLOCK,Debug);
            if (bVar5) {
              base_blob<256u>::ToString_abi_cxx11_(&local_e8,&hash);
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_108,
                         &((psVar6->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->hash);
              logging_function_00._M_str = "FillBlock";
              logging_function_00._M_len = 9;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
              ;
              source_file_00._M_len = 0x62;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_00,source_file_00,0xdf,CMPCTBLOCK,Debug,
                         (ConstevalFormatString<2U>)0x815afc,&local_e8,&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
                  &local_e8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_e8._M_dataplus._M_p._1_7_,
                                         local_e8._M_dataplus._M_p._0_1_),
                                local_e8.field_2._M_allocated_capacity + 1);
              }
            }
            psVar6 = psVar6 + 1;
            RVar13 = READ_STATUS_OK;
          } while (psVar6 != psVar3);
        }
      }
      else {
        RVar13 = state.super_ValidationState<BlockValidationResult>.m_result == BLOCK_MUTATED ^
                 READ_STATUS_CHECKBLOCK_FAILED;
      }
      if (check_block.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*check_block.super__Function_base._M_manager)
                  ((_Any_data *)&check_block,(_Any_data *)&check_block,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
          &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
        operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message.
                        _M_dataplus._M_p,
                        CONCAT71(state.super_ValidationState<BlockValidationResult>.m_debug_message.
                                 field_2._M_allocated_capacity._1_7_,
                                 state.super_ValidationState<BlockValidationResult>.m_debug_message.
                                 field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
          &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
        operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_dataplus._M_p,
                        CONCAT71(state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                                 field_2._M_allocated_capacity._1_7_,
                                 state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                                 field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return RVar13;
  }
LAB_0044c911:
  __stack_chk_fail();
}

Assistant:

ReadStatus PartiallyDownloadedBlock::FillBlock(CBlock& block, const std::vector<CTransactionRef>& vtx_missing)
{
    if (header.IsNull()) return READ_STATUS_INVALID;

    uint256 hash = header.GetHash();
    block = header;
    block.vtx.resize(txn_available.size());

    size_t tx_missing_offset = 0;
    for (size_t i = 0; i < txn_available.size(); i++) {
        if (!txn_available[i]) {
            if (vtx_missing.size() <= tx_missing_offset)
                return READ_STATUS_INVALID;
            block.vtx[i] = vtx_missing[tx_missing_offset++];
        } else
            block.vtx[i] = std::move(txn_available[i]);
    }

    // Make sure we can't call FillBlock again.
    header.SetNull();
    txn_available.clear();

    if (vtx_missing.size() != tx_missing_offset)
        return READ_STATUS_INVALID;

    BlockValidationState state;
    CheckBlockFn check_block = m_check_block_mock ? m_check_block_mock : CheckBlock;
    if (!check_block(block, state, Params().GetConsensus(), /*fCheckPoW=*/true, /*fCheckMerkleRoot=*/true)) {
        // TODO: We really want to just check merkle tree manually here,
        // but that is expensive, and CheckBlock caches a block's
        // "checked-status" (in the CBlock?). CBlock should be able to
        // check its own merkle root and cache that check.
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED)
            return READ_STATUS_FAILED; // Possible Short ID collision
        return READ_STATUS_CHECKBLOCK_FAILED;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Successfully reconstructed block %s with %lu txn prefilled, %lu txn from mempool (incl at least %lu from extra pool) and %lu txn requested\n", hash.ToString(), prefilled_count, mempool_count, extra_count, vtx_missing.size());
    if (vtx_missing.size() < 5) {
        for (const auto& tx : vtx_missing) {
            LogDebug(BCLog::CMPCTBLOCK, "Reconstructed block %s required tx %s\n", hash.ToString(), tx->GetHash().ToString());
        }
    }

    return READ_STATUS_OK;
}